

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

qsizetype QtPrivate::lastIndexOf
                    (QStringView haystack,qsizetype from,QLatin1StringView needle,CaseSensitivity cs
                    )

{
  byte bVar1;
  bool bVar2;
  char16_t *pcVar3;
  char32_t cVar4;
  long lVar5;
  QChar *pQVar6;
  ulong uVar7;
  QChar *start;
  QChar *pQVar8;
  ushort uVar9;
  ulong uVar10;
  byte *pbVar11;
  short sVar12;
  ushort uVar13;
  byte *b;
  int iVar14;
  long lVar15;
  long lVar16;
  QChar *pQVar17;
  size_t l;
  long lVar18;
  ulong uVar19;
  
  b = (byte *)needle.m_data;
  lVar18 = needle.m_size;
  start = (QChar *)haystack.m_data;
  uVar10 = haystack.m_size;
  if (lVar18 != 1) {
    uVar19 = (from >> 0x3f & uVar10) + from;
    if (uVar19 == uVar10 && lVar18 == 0) {
      return uVar19;
    }
    uVar7 = uVar10 - lVar18;
    if ((long)uVar7 < 0 || uVar10 < uVar19) {
      return -1;
    }
    if ((long)uVar19 < (long)uVar7) {
      uVar7 = uVar19;
    }
    pQVar17 = start + uVar7;
    uVar10 = 0;
    if (lVar18 != 0) {
      uVar10 = lVar18 - 1;
    }
    if (cs != CaseSensitive) {
      if (lVar18 < 1) {
        lVar16 = 0;
        lVar5 = 0;
      }
      else {
        pQVar6 = pQVar17 + uVar10;
        lVar5 = 0;
        lVar16 = 0;
        pQVar8 = start;
        lVar15 = lVar18;
        do {
          cVar4 = (anonymous_namespace)::foldCaseHelper<char_const*>
                            ((char *)(b + (lVar15 - (ulong)(lVar18 != 0))),(char *)pQVar8);
          lVar5 = (ulong)(uint)cVar4 + lVar5 * 2;
          pQVar8 = start;
          cVar4 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar6,start);
          lVar16 = (ulong)(uint)cVar4 + lVar16 * 2;
          pQVar6 = pQVar6 + -1;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      if ((long)uVar19 < 0) {
        return -1;
      }
      cVar4 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar17,start);
      lVar16 = lVar16 - (ulong)(uint)cVar4;
      lVar15 = uVar7 * 2;
      do {
        pQVar17 = (QChar *)((long)&start->ucs + lVar15);
        cVar4 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar17,start);
        lVar16 = (ulong)(uint)cVar4 + lVar16;
        if ((lVar16 == lVar5) &&
           (iVar14 = ucstricmp(lVar18,(char16_t *)pQVar17,lVar18,(char *)b), iVar14 == 0)) {
          return lVar15 >> 1;
        }
        if (uVar10 < 0x40) {
          cVar4 = (anonymous_namespace)::foldCaseHelper<QChar_const*>
                            ((QChar *)((long)&start[lVar18 + -1].ucs + lVar15),start);
          lVar16 = lVar16 - ((ulong)(uint)cVar4 << ((byte)uVar10 & 0x3f));
        }
        lVar16 = lVar16 * 2;
        pQVar17 = (QChar *)((long)&start[-1].ucs + lVar15);
        lVar15 = lVar15 + -2;
      } while (start <= pQVar17);
      return -1;
    }
    if (lVar18 < 1) {
      lVar16 = 0;
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      lVar16 = 0;
      lVar15 = lVar18;
      do {
        lVar5 = (ulong)b[lVar15 - (ulong)(lVar18 != 0)] + lVar5 * 2;
        lVar16 = (ulong)*(ushort *)
                         ((long)start + lVar15 * 2 + (uVar7 * 2 - (ulong)((uint)(lVar18 != 0) * 2)))
                 + lVar16 * 2;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    if ((long)uVar19 < 0) {
      return -1;
    }
    lVar16 = lVar16 - (ulong)(ushort)pQVar17->ucs;
    do {
      lVar16 = (ulong)(ushort)pQVar17->ucs + lVar16;
      if (lVar16 == lVar5) {
        pQVar6 = pQVar17;
        pbVar11 = b;
        do {
          if (pQVar17 + lVar18 <= pQVar6) {
            iVar14 = 0;
            break;
          }
          pcVar3 = &pQVar6->ucs;
          bVar1 = *pbVar11;
          pQVar6 = pQVar6 + 1;
          pbVar11 = pbVar11 + 1;
          iVar14 = (uint)(ushort)*pcVar3 - (uint)bVar1;
        } while (iVar14 == 0);
        if (iVar14 == 0) {
          return (long)pQVar17 - (long)start >> 1;
        }
      }
      pQVar17 = pQVar17 + -1;
      if (uVar10 < 0x40) {
        lVar16 = lVar16 - ((ulong)(ushort)pQVar17[lVar18].ucs << ((byte)uVar10 & 0x3f));
      }
      lVar16 = lVar16 * 2;
      if (pQVar17 < start) {
        return -1;
      }
    } while( true );
  }
  if (uVar10 == 0) {
    return -1;
  }
  lVar18 = uVar10 - 1;
  if ((ulong)from <= uVar10) {
    lVar18 = from;
  }
  if (from < 0) {
    lVar18 = from + uVar10;
  }
  if (lVar18 < 0) {
    return -1;
  }
  bVar1 = *b;
  uVar9 = (ushort)bVar1;
  if (cs == CaseSensitive) {
    lVar18 = lVar18 * 2;
    do {
      if (*(ushort *)((long)&start->ucs + lVar18) == (ushort)bVar1) goto LAB_0032f4d5;
      pQVar17 = (QChar *)((long)&start[-1].ucs + lVar18);
      lVar18 = lVar18 + -2;
    } while (start <= pQVar17);
  }
  else {
    sVar12 = (short)((uint)(int)(short)*(ushort *)
                                        (QUnicodeTables::uc_properties +
                                        (ulong)*(ushort *)
                                                (QUnicodeTables::uc_property_trie +
                                                (ulong)((bVar1 & 0x1f) +
                                                       (uint)*(ushort *)
                                                              (QUnicodeTables::uc_property_trie +
                                                              (ulong)(bVar1 >> 5) * 2)) * 2) * 0x14
                                        + 0xe) >> 1);
    if ((*(ushort *)
          (QUnicodeTables::uc_properties +
          (ulong)*(ushort *)
                  (QUnicodeTables::uc_property_trie +
                  (ulong)((bVar1 & 0x1f) +
                         (uint)*(ushort *)
                                (QUnicodeTables::uc_property_trie + (ulong)(bVar1 >> 5) * 2)) * 2) *
          0x14 + 0xe) & 1) == 0) {
      uVar9 = sVar12 + (ushort)bVar1;
    }
    else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar12 * 2) == 1) {
      uVar9 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar12 * 2 + 2);
    }
    lVar18 = lVar18 * 2;
    do {
      uVar13 = *(ushort *)((long)&start->ucs + lVar18);
      sVar12 = (short)((uint)(int)(short)*(ushort *)
                                          (QUnicodeTables::uc_properties +
                                          (ulong)*(ushort *)
                                                  (QUnicodeTables::uc_property_trie +
                                                  (ulong)((uVar13 & 0x1f) +
                                                         (uint)*(ushort *)
                                                                (QUnicodeTables::uc_property_trie +
                                                                (ulong)(uVar13 >> 5) * 2)) * 2) *
                                          0x14 + 0xe) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((uVar13 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie + (ulong)(uVar13 >> 5) * 2)) * 2
                    ) * 0x14 + 0xe) & 1) == 0) {
        uVar13 = sVar12 + uVar13;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar12 * 2) == 1) {
        uVar13 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar12 * 2 + 2);
      }
      if (uVar13 == uVar9) goto LAB_0032f4d5;
      pQVar17 = (QChar *)((long)&start[-1].ucs + lVar18);
      lVar18 = lVar18 + -2;
    } while (start <= pQVar17);
  }
  bVar2 = true;
LAB_0032f4da:
  if (bVar2) {
    return -1;
  }
  return lVar18;
LAB_0032f4d5:
  lVar18 = lVar18 >> 1;
  bVar2 = false;
  goto LAB_0032f4da;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView haystack, qsizetype from, QLatin1StringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}